

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_base_clock(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_base_clock *peVar1;
  envy_bios_power_base_clock_entry *peVar2;
  envy_bios_power_base_clock_entry *bce;
  int j;
  int i;
  envy_bios_power_base_clock *bc;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).base_clock;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).base_clock.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BASE CLOCK table at 0x%x, version %x\n",
              (ulong)peVar1->offset,(ulong)(bios->power).base_clock.version);
    }
    else {
      fprintf((FILE *)out,"BASE CLOCK table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).base_clock.version);
      if ((((bios->power).base_clock.version == '\x10') || ((bios->power).base_clock.version == ' ')
          ) && ((bios->power).base_clock.entriesnum != '\0')) {
        if ((bios->power).base_clock.boost_entry != 0xff) {
          fprintf((FILE *)out,"boost entry: %i\n",(ulong)(bios->power).base_clock.boost_entry);
        }
        if ((bios->power).base_clock.turbo_boost_entry != 0xff) {
          fprintf((FILE *)out,"turbo boost entry: %i\n",
                  (ulong)(bios->power).base_clock.turbo_boost_entry);
        }
        if ((bios->power).base_clock.rated_tdp_entry != 0xff) {
          fprintf((FILE *)out,"rated tdp entry: %i\n",
                  (ulong)(bios->power).base_clock.rated_tdp_entry);
        }
        if ((bios->power).base_clock.vrhot_entry != 0xff) {
          fprintf((FILE *)out,"vrhot entry: %i\n",(ulong)(bios->power).base_clock.vrhot_entry);
        }
        if ((bios->power).base_clock.max_batt_entry != 0xff) {
          fprintf((FILE *)out,"max batt entry: %i\n",(ulong)(bios->power).base_clock.max_batt_entry)
          ;
        }
      }
      if (((bios->power).base_clock.version == '\x10') &&
         ((bios->power).base_clock.entriesnum != '\0')) {
        if ((bios->power).base_clock.d2_entry != 0xff) {
          fprintf((FILE *)out,"d2 entry: %i\n",(ulong)(bios->power).base_clock.d2_entry);
        }
        if ((bios->power).base_clock.d3_entry != 0xff) {
          fprintf((FILE *)out,"d3 entry: %i\n",(ulong)(bios->power).base_clock.d3_entry);
        }
        if ((bios->power).base_clock.d4_entry != 0xff) {
          fprintf((FILE *)out,"d4 entry: %i\n",(ulong)(bios->power).base_clock.d4_entry);
        }
        if ((bios->power).base_clock.d5_entry != 0xff) {
          fprintf((FILE *)out,"d5 entry: %i\n",(ulong)(bios->power).base_clock.d5_entry);
        }
        if ((bios->power).base_clock.over_current_entry != 0xff) {
          fprintf((FILE *)out,"over current entry: %i\n",
                  (ulong)(bios->power).base_clock.over_current_entry);
        }
        if ((bios->power).base_clock.max_sli_entry != 0xff) {
          fprintf((FILE *)out,"max sli entry: %i\n",(ulong)(bios->power).base_clock.max_sli_entry);
        }
        if ((bios->power).base_clock.max_therm_sustain_entry != 0xff) {
          fprintf((FILE *)out,"max therm sustain entry: %i\n",
                  (ulong)(bios->power).base_clock.max_therm_sustain_entry);
        }
        if ((bios->power).base_clock.slowdown_pwr_entry != 0xff) {
          fprintf((FILE *)out,"slowdown pwr entry: %i\n",
                  (ulong)(bios->power).base_clock.slowdown_pwr_entry);
        }
        if ((bios->power).base_clock.mid_point_entry != 0xff) {
          fprintf((FILE *)out,"mid point entry: %i\n",
                  (ulong)(bios->power).base_clock.mid_point_entry);
        }
        if ((bios->power).base_clock.unk15_entry != 0xff) {
          fprintf((FILE *)out,"unk15 entry: %i\n",(ulong)(bios->power).base_clock.unk15_entry);
        }
        if ((bios->power).base_clock.unk16_entry != 0xff) {
          fprintf((FILE *)out,"unk16 entry: %i\n",(ulong)(bios->power).base_clock.unk16_entry);
        }
      }
      else if (((bios->power).base_clock.version == ' ') &&
              ((bios->power).base_clock.entriesnum != '\0')) {
        if ((bios->power).base_clock.unk15_entry != 0xff) {
          fprintf((FILE *)out,"unk0e entry: %i\n",(ulong)(bios->power).base_clock.unk15_entry);
        }
        if ((bios->power).base_clock.unk16_entry != 0xff) {
          fprintf((FILE *)out,"unk0f entry: %i\n",(ulong)(bios->power).base_clock.unk16_entry);
        }
      }
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).base_clock.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (bce._4_4_ = 0; (int)bce._4_4_ < (int)(uint)(bios->power).base_clock.entriesnum;
          bce._4_4_ = bce._4_4_ + 1) {
        peVar2 = (bios->power).base_clock.entries + (int)bce._4_4_;
        if (((peVar2 != (envy_bios_power_base_clock_entry *)0x0) && (peVar2->pstate != '\0')) &&
           (peVar2->pstate != 0xff)) {
          if ((0xf < (bios->power).base_clock.version) && ((bios->power).base_clock.version < 0x21))
          {
            fprintf((FILE *)out,
                    "-- entry %i, pstate = %x, reqPower = %i mW, reqSlowdownPower = %i mW",
                    (ulong)bce._4_4_,(ulong)peVar2->pstate,(ulong)((uint)peVar2->reqPower * 10),
                    (ulong)((uint)peVar2->reqSlowdownPower * 10));
            for (bce._0_4_ = 0; (int)(uint)bce < (int)(uint)(bios->power).base_clock.secount;
                bce._0_4_ = (uint)bce + 1) {
              fprintf((FILE *)out,", clock%i = %i MHz",(ulong)(uint)bce,
                      (ulong)peVar2->clock[(int)(uint)bce]);
            }
            fprintf((FILE *)out,"\n");
          }
          envy_bios_dump_hex(bios,out,peVar2->offset,
                             (uint)(bios->power).base_clock.rlen +
                             (uint)(bios->power).base_clock.selen *
                             (uint)(bios->power).base_clock.secount,mask);
          if ((mask & 0x80000000) != 0) {
            fprintf((FILE *)out,"\n");
          }
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_base_clock(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_base_clock *bc = &bios->power.base_clock;
	int i, j;

	if (!bc->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!bc->valid) {
		fprintf(out, "Failed to parse BASE CLOCK table at 0x%x, version %x\n", bc->offset, bc->version);
		return;
	}

	fprintf(out, "BASE CLOCK table at 0x%x, version %x\n", bc->offset, bc->version);

	if ((bc->version == 0x10 || bc->version == 0x20) && bc->entriesnum) {
		if (bc->boost_entry != 0xff)
			fprintf(out, "boost entry: %i\n", bc->boost_entry);
		if (bc->turbo_boost_entry != 0xff)
			fprintf(out, "turbo boost entry: %i\n", bc->turbo_boost_entry);
		if (bc->rated_tdp_entry != 0xff)
			fprintf(out, "rated tdp entry: %i\n", bc->rated_tdp_entry);
		if (bc->vrhot_entry != 0xff)
			fprintf(out, "vrhot entry: %i\n", bc->vrhot_entry);
		if (bc->max_batt_entry != 0xff)
			fprintf(out, "max batt entry: %i\n", bc->max_batt_entry);
	}

	if (bc->version == 0x10 && bc->entriesnum) {
		if (bc->d2_entry != 0xff)
			fprintf(out, "d2 entry: %i\n", bc->d2_entry);
		if (bc->d3_entry != 0xff)
			fprintf(out, "d3 entry: %i\n", bc->d3_entry);
		if (bc->d4_entry != 0xff)
			fprintf(out, "d4 entry: %i\n", bc->d4_entry);
		if (bc->d5_entry != 0xff)
			fprintf(out, "d5 entry: %i\n", bc->d5_entry);
		if (bc->over_current_entry != 0xff)
			fprintf(out, "over current entry: %i\n", bc->over_current_entry);
		if (bc->max_sli_entry != 0xff)
			fprintf(out, "max sli entry: %i\n", bc->max_sli_entry);
		if (bc->max_therm_sustain_entry != 0xff)
			fprintf(out, "max therm sustain entry: %i\n", bc->max_therm_sustain_entry);
		if (bc->slowdown_pwr_entry != 0xff)
			fprintf(out, "slowdown pwr entry: %i\n", bc->slowdown_pwr_entry);
		if (bc->mid_point_entry != 0xff)
			fprintf(out, "mid point entry: %i\n", bc->mid_point_entry);
		if (bc->unk15_entry != 0xff)
			fprintf(out, "unk15 entry: %i\n", bc->unk15_entry);
		if (bc->unk16_entry != 0xff)
			fprintf(out, "unk16 entry: %i\n", bc->unk16_entry);
	} else if (bc->version == 0x20 && bc->entriesnum) {
		if (bc->unk15_entry != 0xff)
			fprintf(out, "unk0e entry: %i\n", bc->unk15_entry);
		if (bc->unk16_entry != 0xff)
			fprintf(out, "unk0f entry: %i\n", bc->unk16_entry);
	}

	envy_bios_dump_hex(bios, out, bc->offset, bc->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < bc->entriesnum; i++) {
		struct envy_bios_power_base_clock_entry *bce = &bc->entries[i];

		if (!bce || bce->pstate == 0x0 || bce->pstate == 0xff)
			continue;

		if (bc->version >= 0x10 && bc->version <= 0x20) {
			fprintf(out, "-- entry %i, pstate = %x, reqPower = %i mW, reqSlowdownPower = %i mW",
			        i, bce->pstate, bce->reqPower * 10, bce->reqSlowdownPower * 10);
			for (j = 0; j < bc->secount; j++)
				fprintf(out, ", clock%i = %i MHz", j, bce->clock[j]);
			fprintf(out, "\n");
		}

		envy_bios_dump_hex(bios, out, bce->offset, bc->rlen + (bc->selen * bc->secount), mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}